

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_upsert.cpp
# Opt level: O2

unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true> __thiscall
duckdb::Transformer::TransformOnConflictClause
          (Transformer *this,PGOnConflictClause *node,string *param_2)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  PGList *where_clause;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  _Alloc_hider __p;
  OnConflictAction OVar3;
  pointer pOVar4;
  PGOnConflictClause *pPVar5;
  NotImplementedException *this_00;
  Transformer *this_01;
  optional_ptr<duckdb_libpgquery::PGOnConflictClause,_true> stmt;
  allocator local_41;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_40;
  
  this_01 = (Transformer *)node;
  stmt.ptr = (PGOnConflictClause *)param_2;
  make_uniq<duckdb::OnConflictInfo>();
  OVar3 = TransformOnConflictAction((PGOnConflictClause *)param_2);
  pOVar4 = unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>::
           operator->((unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>
                       *)this);
  pOVar4->action_type = OVar3;
  pPVar5 = optional_ptr<duckdb_libpgquery::PGOnConflictClause,_true>::operator->(&stmt);
  if (pPVar5->infer != (PGInferClause *)0x0) {
    pPVar5 = optional_ptr<duckdb_libpgquery::PGOnConflictClause,_true>::operator->(&stmt);
    if (pPVar5->infer->indexElems == (PGList *)0x0) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffc0,
                 "ON CONSTRAINT conflict target is not supported yet",&local_41);
      NotImplementedException::NotImplementedException(this_00,(string *)&stack0xffffffffffffffc0);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pPVar5 = optional_ptr<duckdb_libpgquery::PGOnConflictClause,_true>::operator->(&stmt);
    TransformConflictTarget_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)&stack0xffffffffffffffc0,this_01,pPVar5->infer->indexElems);
    pOVar4 = unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>::
             operator->((unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>
                         *)this);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&pOVar4->indexed_columns,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffffc0);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffffc0);
    pPVar5 = optional_ptr<duckdb_libpgquery::PGOnConflictClause,_true>::operator->(&stmt);
    if (pPVar5->infer->whereClause != (PGNode *)0x0) {
      optional_ptr<duckdb_libpgquery::PGOnConflictClause,_true>::operator->(&stmt);
      TransformExpression((Transformer *)&stack0xffffffffffffffc0,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)node);
      pOVar4 = unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>
               ::operator->((unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>
                             *)this);
      _Var2._M_head_impl = local_40._M_head_impl;
      local_40._M_head_impl = (ParsedExpression *)0x0;
      _Var1._M_head_impl =
           (pOVar4->condition).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pOVar4->condition).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
      if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
        if ((__uniq_ptr_impl<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>)
            local_40._M_head_impl !=
            (__uniq_ptr_impl<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>)0x0
           ) {
          (**(code **)(*(long *)local_40._M_head_impl + 8))();
        }
      }
    }
  }
  pOVar4 = unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>::
           operator->((unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>
                       *)this);
  if (pOVar4->action_type == UPDATE) {
    pPVar5 = optional_ptr<duckdb_libpgquery::PGOnConflictClause,_true>::operator->(&stmt);
    where_clause = pPVar5->targetList;
    optional_ptr<duckdb_libpgquery::PGOnConflictClause,_true>::operator->(&stmt);
    TransformUpdateSetInfo
              ((Transformer *)&stack0xffffffffffffffc0,(PGList *)node,(PGNode *)where_clause);
    pOVar4 = unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>::
             operator->((unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>,_true>
                         *)this);
    __p._M_p = (pointer)local_40._M_head_impl;
    local_40._M_head_impl = (ParsedExpression *)0x0;
    ::std::__uniq_ptr_impl<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>::
    reset((__uniq_ptr_impl<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_> *)
          &pOVar4->set_info,(pointer)__p._M_p);
    ::std::unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_>::
    ~unique_ptr((unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>_> *)
                &stack0xffffffffffffffc0);
  }
  return (unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)
         (unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>)this;
}

Assistant:

unique_ptr<OnConflictInfo> Transformer::TransformOnConflictClause(duckdb_libpgquery::PGOnConflictClause *node,
                                                                  const string &) {

	auto stmt = PGPointerCast<duckdb_libpgquery::PGOnConflictClause>(node);
	D_ASSERT(stmt);

	auto result = make_uniq<OnConflictInfo>();
	result->action_type = TransformOnConflictAction(stmt.get());

	if (stmt->infer) {
		// A filter for the ON CONFLICT ... is specified.
		if (!stmt->infer->indexElems) {
			throw NotImplementedException("ON CONSTRAINT conflict target is not supported yet");
		}
		result->indexed_columns = TransformConflictTarget(*stmt->infer->indexElems);
		if (stmt->infer->whereClause) {
			result->condition = TransformExpression(stmt->infer->whereClause);
		}
	}

	if (result->action_type == OnConflictAction::UPDATE) {
		result->set_info = TransformUpdateSetInfo(stmt->targetList, stmt->whereClause);
	}
	return result;
}